

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall
ACSStringPool::FindString(ACSStringPool *this,char *str,size_t len,uint h,uint bucketnum)

{
  int iVar1;
  PoolEntry *this_00;
  size_t sVar2;
  char *__s1;
  PoolEntry *entry;
  uint i;
  uint bucketnum_local;
  uint h_local;
  size_t len_local;
  char *str_local;
  ACSStringPool *this_local;
  
  entry._4_4_ = this->PoolBuckets[bucketnum];
  while( true ) {
    if (entry._4_4_ == 0xffffffff) {
      return -1;
    }
    this_00 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                        (&this->Pool,(ulong)entry._4_4_);
    if (this_00->Next == 0xfffffffe) break;
    if ((this_00->Hash == h) && (sVar2 = FString::Len(&this_00->Str), sVar2 == len)) {
      __s1 = FString::GetChars(&this_00->Str);
      iVar1 = memcmp(__s1,str,len);
      if (iVar1 == 0) {
        return entry._4_4_;
      }
    }
    entry._4_4_ = this_00->Next;
  }
  __assert_fail("entry->Next != FREE_ENTRY",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_acs.cpp"
                ,0x289,
                "int ACSStringPool::FindString(const char *, size_t, unsigned int, unsigned int)");
}

Assistant:

int ACSStringPool::FindString(const char *str, size_t len, unsigned int h, unsigned int bucketnum)
{
	unsigned int i = PoolBuckets[bucketnum];
	while (i != NO_ENTRY)
	{
		PoolEntry *entry = &Pool[i];
		assert(entry->Next != FREE_ENTRY);
		if (entry->Hash == h && entry->Str.Len() == len &&
			memcmp(entry->Str.GetChars(), str, len) == 0)
		{
			return i;
		}
		i = entry->Next;
	}
	return -1;
}